

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_insert_meta(lyd_node *parent,lyd_meta *meta,ly_bool clear_dflt)

{
  lyd_meta *local_30;
  lyd_meta *iter;
  lyd_meta *last;
  ly_bool clear_dflt_local;
  lyd_meta *meta_local;
  lyd_node *parent_local;
  
  if (parent == (lyd_node *)0x0) {
    __assert_fail("parent",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x4f3,"void lyd_insert_meta(struct lyd_node *, struct lyd_meta *, ly_bool)");
  }
  local_30 = meta;
  if (meta != (lyd_meta *)0x0) {
    for (; local_30 != (lyd_meta *)0x0; local_30 = local_30->next) {
      local_30->parent = parent;
    }
    if (parent->meta == (lyd_meta *)0x0) {
      parent->meta = meta;
    }
    else {
      for (iter = parent->meta; iter->next != (lyd_meta *)0x0; iter = iter->next) {
      }
      iter->next = meta;
    }
    if (clear_dflt != '\0') {
      lyd_np_cont_dflt_del(parent);
    }
  }
  return;
}

Assistant:

void
lyd_insert_meta(struct lyd_node *parent, struct lyd_meta *meta, ly_bool clear_dflt)
{
    struct lyd_meta *last, *iter;

    assert(parent);

    if (!meta) {
        return;
    }

    for (iter = meta; iter; iter = iter->next) {
        iter->parent = parent;
    }

    /* insert as the last attribute */
    if (parent->meta) {
        for (last = parent->meta; last->next; last = last->next) {}
        last->next = meta;
    } else {
        parent->meta = meta;
    }

    /* remove default flags from NP containers */
    if (clear_dflt) {
        lyd_np_cont_dflt_del(parent);
    }
}